

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec75.c
# Opt level: O3

int If_CutPerformCheck75__(If_Man_t *p,uint *pTruth,int nVars,int nLeaves,char *pStr)

{
  int shift;
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong *uTruth;
  int nVarsMin;
  char pDsdStr [1000];
  char *in_stack_fffffffffffffbb8;
  int local_43c;
  ulong local_438 [4];
  char local_418 [1000];
  
  If_CutPerformCheck75__::Counter = If_CutPerformCheck75__::Counter + 1;
  uVar2 = 1;
  if (5 < nLeaves) {
    if (8 < (uint)nLeaves) {
      __assert_fail("nLeaves <= 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec75.c"
                    ,0xd4,"int If_CutPerformCheck75__(If_Man_t *, unsigned int *, int, int, char *)"
                   );
    }
    if (nLeaves == 8) {
      uVar2 = 0;
      iVar1 = Dau_DsdDecompose((word *)pTruth,8,0,0,local_418);
      if (iVar1 < 5) {
        uVar2 = Dau_DsdCheckDecAndExist(in_stack_fffffffffffffbb8);
        uVar2 = uVar2 >> 4 & 1;
      }
    }
    else {
      iVar1 = If_CutPerformCheck16(p,pTruth,nVars,nLeaves,"44");
      if (iVar1 == 0) {
        iVar1 = Dau_DsdDecompose((word *)pTruth,nLeaves,0,0,local_418);
        if (nLeaves == 7) {
          if (iVar1 < 5) {
            uVar2 = Dau_DsdCheckDecExist(in_stack_fffffffffffffbb8);
            if ((uVar2 & 0x10) != 0) {
              return 1;
            }
            uVar2 = Dau_DsdCheckDecAndExist(in_stack_fffffffffffffbb8);
            if ((uVar2 & 0x18) != 0) {
              return 1;
            }
          }
          lVar10 = 0;
          do {
            local_438[3] = *(ulong *)pTruth;
            local_438[2] = local_438[3];
            local_438[0] = *(ulong *)(pTruth + 2);
            local_438[1] = local_438[0];
            if (lVar10 != 6) {
              uVar6 = local_438[3] & s_Truths6Neg[lVar10];
              bVar5 = (byte)(1 << ((byte)lVar10 & 0x1f));
              uVar8 = s_Truths6Neg[lVar10] & local_438[0];
              uVar7 = local_438[3] & s_Truths6[lVar10];
              local_438[2] = uVar6 << (bVar5 & 0x3f) | uVar6;
              local_438[3] = uVar8 << (bVar5 & 0x3f) | uVar8;
              local_438[1] = local_438[0] & s_Truths6[lVar10];
              local_438[0] = uVar7 >> (bVar5 & 0x3f) | uVar7;
              local_438[1] = local_438[1] | local_438[1] >> (bVar5 & 0x3f);
            }
            lVar4 = 0;
            iVar1 = 0;
            do {
              if (lVar4 == 6) {
                if (local_438[2] == local_438[3]) break;
LAB_00421e63:
                iVar1 = iVar1 + 1;
              }
              else {
                lVar9 = 0;
                do {
                  if (((local_438[lVar9 + 2] >> ((byte)(1 << ((byte)lVar4 & 0x1f)) & 0x3f) ^
                       local_438[lVar9 + 2]) & s_Truths6Neg[lVar4]) != 0) goto LAB_00421e63;
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 2);
              }
              lVar4 = lVar4 + 1;
            } while (lVar4 != 7);
            if (iVar1 < 4) {
              uTruth = local_438;
LAB_00421f07:
              If_Dec7MinimumBase(uTruth,(int *)0x0,7,&local_43c);
              iVar1 = Dau_DsdDecompose(uTruth,local_43c,0,0,local_418);
              if ((iVar1 < 5) &&
                 (uVar2 = Dau_DsdCheckDecExist(in_stack_fffffffffffffbb8), (uVar2 & 0x18) != 0)) {
                return 1;
              }
            }
            else {
              lVar4 = 0;
              iVar1 = 0;
              do {
                if (lVar4 == 6) {
                  if (local_438[0] == local_438[1]) break;
LAB_00421ec1:
                  iVar1 = iVar1 + 1;
                }
                else {
                  lVar9 = 0;
                  do {
                    if (((local_438[lVar9] >> ((byte)(1 << ((byte)lVar4 & 0x1f)) & 0x3f) ^
                         local_438[lVar9]) & s_Truths6Neg[lVar4]) != 0) goto LAB_00421ec1;
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 2);
                }
                lVar4 = lVar4 + 1;
              } while (lVar4 != 7);
              if (iVar1 < 4) {
                uTruth = local_438 + 2;
                goto LAB_00421f07;
              }
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 7);
          uVar2 = 0;
        }
        else if ((4 < iVar1) ||
                ((uVar3 = Dau_DsdCheckDecExist(in_stack_fffffffffffffbb8), (uVar3 & 0x18) == 0 &&
                 (uVar3 = Dau_DsdCheckDecAndExist(in_stack_fffffffffffffbb8), (uVar3 & 0x1c) == 0)))
                ) {
          uVar2 = If_CutPerformCheck07(p,pTruth,nVars,6,pStr);
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int If_CutPerformCheck75__( If_Man_t * p, unsigned * pTruth, int nVars, int nLeaves, char * pStr )
{
    char pDsdStr[1000];
    int nSizeNonDec, nDecExists, nDecAndExists;
    static int Counter = 0;
    Counter++;
    if ( nLeaves < 6 )
        return 1;
    assert( nLeaves <= 8 );
    if ( nLeaves < 8 && If_CutPerformCheck16( p, pTruth, nVars, nLeaves, "44" ) )
        return 1;
    // check decomposability
    nSizeNonDec = Dau_DsdDecompose( (word *)pTruth, nLeaves, 0, 0, pDsdStr );
//    printf( "Vars = %d  %s", nLeaves, pDsdStr );    printf( "\n" );
//    Extra_PrintBinary( stdout, &nDecExists, 8 );    printf( "\n" );
//    Extra_PrintBinary( stdout, &nDecAndExists, 8 ); printf( "\n" );
    if ( nLeaves == 8 )
    {
        if ( nSizeNonDec >= 5 )
            return 0;
        nDecAndExists = Dau_DsdCheckDecAndExist( pDsdStr );
        if ( nDecAndExists & 0x10 ) // bit 4
            return 1;
        else
            return 0;
    }
    if ( nLeaves == 7 )
    {
        extern void If_Dec7MinimumBase( word uTruth[2], int * pSupp, int nVarsAll, int * pnVars );
        word * pT = (word *)pTruth;
        word pCof0[2], pCof1[2];
        int v, nVarsMin;
        if ( nSizeNonDec < 5 )
        {
            nDecExists = Dau_DsdCheckDecExist( pDsdStr );
            if ( nDecExists & 0x10 ) // bit 4
                return 1;
            nDecAndExists = Dau_DsdCheckDecAndExist( pDsdStr );
            if ( nDecAndExists & 0x18 ) // bit 4, 3
                return 1;
        }
        // check cofactors
        for ( v = 0; v < 7; v++ )
        {
            pCof0[0] = pCof1[0] = pT[0];
            pCof0[1] = pCof1[1] = pT[1];
            Abc_TtCofactor0( pCof0, 2, v );
            Abc_TtCofactor1( pCof1, 2, v );
            if ( Abc_TtSupportSize(pCof0, 7) < 4 )
            {
                If_Dec7MinimumBase( pCof1, NULL, 7, &nVarsMin );
                nSizeNonDec = Dau_DsdDecompose( pCof1, nVarsMin, 0, 0, pDsdStr );
                if ( nSizeNonDec >= 5 )
                    continue;
                nDecExists = Dau_DsdCheckDecExist( pDsdStr );
                if ( nDecExists & 0x18 ) // bit 4, 3
                    return 1;
            }
            else if ( Abc_TtSupportSize(pCof1, 7) < 4 )
            {
                If_Dec7MinimumBase( pCof0, NULL, 7, &nVarsMin );
                nSizeNonDec = Dau_DsdDecompose( pCof0, nVarsMin, 0, 0, pDsdStr );
                if ( nSizeNonDec >= 5 )
                    continue;
                nDecExists = Dau_DsdCheckDecExist( pDsdStr );
                if ( nDecExists & 0x18 ) // bit 4, 3
                    return 1;
            }
        }
        return 0;
    }
    if ( nLeaves == 6 )
    {
        if ( nSizeNonDec < 5 )
        {
            nDecExists = Dau_DsdCheckDecExist( pDsdStr );
            if ( nDecExists & 0x18 ) // bit 4, 3
                return 1;
            nDecAndExists = Dau_DsdCheckDecAndExist( pDsdStr );
            if ( nDecAndExists & 0x1C ) // bit 4, 3, 2
                return 1;
        }
        return If_CutPerformCheck07( p, pTruth, nVars, nLeaves, pStr );
    }
    assert( 0 );
    return 0;
}